

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBoxDetailsText::QMessageBoxDetailsText(QMessageBoxDetailsText *this,QWidget *parent)

{
  ContextType *context;
  QLayout *l;
  offset_in_QMessageBoxDetailsText_to_subr *slot;
  QWidget *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QFrame *line;
  QVBoxLayout *layout;
  undefined4 in_stack_ffffffffffffff18;
  FocusPolicy in_stack_ffffffffffffff1c;
  QWidget *in_stack_ffffffffffffff28;
  ContextType *parent_00;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QWidget *in_stack_ffffffffffffff30;
  ContextType *this_00;
  undefined1 ro;
  undefined8 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::WindowType> f;
  QWidget *pQVar1;
  QWidget *this_01;
  Object *sender;
  ConnectionType type;
  Connection local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  QPaintDevice local_c;
  undefined3 uStack_b;
  long local_8;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (QPaintDevice)0x0;
  uStack_b = 0;
  pQVar1 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7ab10e);
  type = (ConnectionType)pQVar1;
  QWidget::QWidget(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(WindowFlags)f.i);
  *in_RDI = &PTR_metaObject_00d257e0;
  in_RDI[2] = &PTR__QMessageBoxDetailsText_00d25990;
  *(undefined1 *)(in_RDI + 5) = 0;
  context = (ContextType *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_RSI);
  pQVar1 = (QWidget *)&stack0xffffffffffffffe4;
  parent_00 = context;
  this_00 = context;
  QMargins::QMargins((QMargins *)in_RSI);
  QLayout::setContentsMargins((QLayout *)this_00,(QMargins *)parent_00);
  this_01 = (QWidget *)0x28;
  l = (QLayout *)operator_new(0x28);
  local_20 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7ab1c0);
  QFrame::QFrame((QFrame *)this_00,&parent_00->super_QWidget,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar1 >> 0x20,0));
  alignment.i = (Int)((ulong)parent_00 >> 0x20);
  QFrame::setFrameShape((QFrame *)this_00,alignment.i);
  QFrame::setFrameShadow((QFrame *)this_00,alignment.i);
  local_24 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7ab239);
  QBoxLayout::addWidget
            ((QBoxLayout *)in_RSI,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0,
             (Alignment)alignment.i);
  slot = (offset_in_QMessageBoxDetailsText_to_subr *)operator_new((ulong)this_01);
  TextEdit::TextEdit((TextEdit *)in_RSI,
                     (QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  in_RDI[6] = slot;
  QWidget::setFixedHeight(pQVar1,(int)((ulong)this_00 >> 0x20));
  ro = (undefined1)((ulong)this_00 >> 0x38);
  QWidget::setFocusPolicy(in_RSI,in_stack_ffffffffffffff1c);
  QTextEdit::setReadOnly((QTextEdit *)pQVar1,(bool)ro);
  sender = (Object *)in_RDI[6];
  local_28 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7ab2e6);
  QBoxLayout::addWidget
            ((QBoxLayout *)in_RSI,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0,
             (Alignment)alignment.i);
  QWidget::setLayout(this_01,l);
  QObject::connect<void(QTextEdit::*)(bool),void(QMessageBoxDetailsText::*)(bool)>
            (sender,(offset_in_QTextEdit_to_subr)QTextEdit::copyAvailable,context,slot,type);
  QMetaObject::Connection::~Connection(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessageBoxDetailsText(QWidget *parent=nullptr)
        : QWidget(parent)
        , copyAvailable(false)
    {
        QVBoxLayout *layout = new QVBoxLayout;
        layout->setContentsMargins(QMargins());
        QFrame *line = new QFrame(this);
        line->setFrameShape(QFrame::HLine);
        line->setFrameShadow(QFrame::Sunken);
        layout->addWidget(line);
        textEdit = new TextEdit();
        textEdit->setFixedHeight(100);
        textEdit->setFocusPolicy(Qt::NoFocus);
        textEdit->setReadOnly(true);
        layout->addWidget(textEdit);
        setLayout(layout);

        connect(textEdit, &TextEdit::copyAvailable,
                this, &QMessageBoxDetailsText::textCopyAvailable);
    }